

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_slice(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,h262_slice *slice)

{
  int iVar1;
  uint uVar2;
  h262_picparm *in_RCX;
  uint uVar3;
  h262_seqparm *in_RDX;
  bitstream *in_RSI;
  int *in_RDI;
  uint32_t curr_mb_addr;
  uint32_t qsc;
  uint32_t tmp;
  uint32_t tmp_1;
  int in_stack_ffffffffffffffbc;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint32_t uVar4;
  uint in_stack_ffffffffffffffd4;
  
  iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (uint32_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
  if ((iVar1 == 0) &&
     (iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (uint32_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc), iVar1 == 0)) {
    if (in_RCX->vbv_delay == 0) {
LAB_00106c9b:
      uVar3 = in_RCX->forward_f_code % (uint)in_RDX[1].has_disp_ext;
      iVar1 = h262_mb_addr_inc((bitstream *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (uint32_t *)
                               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      if (iVar1 == 0) {
        if (uVar3 < (uint)in_RDX[1].has_disp_ext) {
          in_RCX->forward_f_code = in_RCX->temporal_reference * in_RDX[1].has_disp_ext + uVar3;
          uVar4 = in_RCX->picture_coding_type;
          uVar2 = in_RCX->forward_f_code;
          do {
            while( true ) {
              iVar1 = h262_macroblock(in_RSI,in_RDX,in_RCX,
                                      (h262_macroblock *)CONCAT44(in_stack_ffffffffffffffd4,uVar3),
                                      (uint32_t *)CONCAT44(uVar4,uVar2));
              if (iVar1 != 0) {
                return 1;
              }
              if (*in_RDI != 1) break;
              in_RCX->full_pel_backward_vector = uVar2;
              uVar2 = uVar2 + 1;
              iVar1 = vs_has_more_data((bitstream *)CONCAT44(uVar4,uVar2));
              if (iVar1 == 0) {
                return 0;
              }
              iVar1 = h262_mb_addr_inc((bitstream *)CONCAT44(uVar4,uVar2),
                                       (uint32_t *)
                                       CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)
                                      );
              if (iVar1 != 0) {
                return 1;
              }
              if (in_RDX[1].colour_description <= uVar2) {
                fprintf(_stderr,"MB index overflow\n");
                return 1;
              }
              for (; uVar3 != 0; uVar3 = uVar3 - 1) {
                *(undefined4 *)(*(long *)&in_RCX->backward_f_code + (ulong)uVar2 * 0xc84) = 1;
                *(undefined4 *)(*(long *)&in_RCX->backward_f_code + (ulong)uVar2 * 0xc84 + 4) = 0;
                *(undefined4 *)(*(long *)&in_RCX->backward_f_code + (ulong)uVar2 * 0xc84 + 8) = 0;
                *(undefined4 *)(*(long *)&in_RCX->backward_f_code + (ulong)uVar2 * 0xc84 + 0xc) = 0;
                *(undefined4 *)(*(long *)&in_RCX->backward_f_code + (ulong)uVar2 * 0xc84 + 0x10) = 0
                ;
                *(undefined4 *)(*(long *)&in_RCX->backward_f_code + (ulong)uVar2 * 0xc84 + 0x14) = 0
                ;
                iVar1 = h262_infer_vectors((bitstream *)in_RCX,
                                           (h262_seqparm *)CONCAT44(in_stack_ffffffffffffffd4,uVar3)
                                           ,(h262_picparm *)CONCAT44(uVar4,uVar2),
                                           (h262_macroblock *)
                                           CONCAT17(in_stack_ffffffffffffffc7,
                                                    in_stack_ffffffffffffffc0),
                                           in_stack_ffffffffffffffbc);
                if (iVar1 != 0) {
                  return 1;
                }
                iVar1 = h262_infer_vectors((bitstream *)in_RCX,
                                           (h262_seqparm *)CONCAT44(in_stack_ffffffffffffffd4,uVar3)
                                           ,(h262_picparm *)CONCAT44(uVar4,uVar2),
                                           (h262_macroblock *)
                                           CONCAT17(in_stack_ffffffffffffffc7,
                                                    in_stack_ffffffffffffffc0),
                                           in_stack_ffffffffffffffbc);
                if (iVar1 != 0) {
                  return 1;
                }
                uVar2 = uVar2 + 1;
                if (in_RDX[1].colour_description <= uVar2) {
                  fprintf(_stderr,"MB index overflow\n");
                  return 1;
                }
              }
            }
            if (in_RCX->full_pel_backward_vector == uVar2) {
              return 0;
            }
            uVar3 = 0;
            while( true ) {
              in_stack_ffffffffffffffc7 = false;
              if (in_RCX->full_pel_backward_vector != uVar2) {
                in_stack_ffffffffffffffc7 =
                     *(int *)(*(long *)&in_RCX->backward_f_code + (ulong)uVar2 * 0xc84) != 0;
              }
              if ((bool)in_stack_ffffffffffffffc7 == false) break;
              uVar3 = uVar3 + 1;
              uVar2 = uVar2 + 1;
            }
            if (in_RCX->full_pel_backward_vector == uVar2) {
              fprintf(_stderr,"Last MB in slice is skipped\n");
              return 1;
            }
            iVar1 = h262_mb_addr_inc((bitstream *)CONCAT44(uVar4,uVar2),
                                     (uint32_t *)(ulong)in_stack_ffffffffffffffc0);
          } while (iVar1 == 0);
        }
        else {
          fprintf(_stderr,"Initial mb_addr_inc too large\n");
        }
      }
    }
    else {
      iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (uint32_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
      if (iVar1 == 0) {
        in_stack_ffffffffffffffd4 = 0;
        iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (uint32_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc);
        while (iVar1 == 0) {
          if ((in_stack_ffffffffffffffd4 & 1) == 0) goto LAB_00106c9b;
          iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (uint32_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
        }
      }
    }
  }
  return 1;
}

Assistant:

int h262_slice(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_slice *slice) {
	if (vs_u(str, &slice->quantiser_scale_code, 5))
		return 1;
	if (vs_u(str, &slice->intra_slice_flag, 1)) return 1;
	if (slice->intra_slice_flag) {
		if (vs_u(str, &slice->intra_slice, 1)) return 1;
		uint32_t tmp = 0;
		if (vs_u(str, &tmp, 8)) return 1;
		while(tmp & 1) {
			if (vs_u(str, &tmp, 9)) return 1;
		}
	}
	uint32_t tmp = slice->first_mb_in_slice % picparm->pic_width_in_mbs;
	if (h262_mb_addr_inc(str, &tmp)) return 1;
	if (tmp >= picparm->pic_width_in_mbs) {
		fprintf(stderr, "Initial mb_addr_inc too large\n");
		return 1;
	}
	slice->first_mb_in_slice = slice->slice_vertical_position * picparm->pic_width_in_mbs + tmp;
	uint32_t qsc = slice->quantiser_scale_code;
	uint32_t curr_mb_addr = slice->first_mb_in_slice;
	while (1) {
		if (h262_macroblock(str, seqparm, picparm, &slice->mbs[curr_mb_addr], &qsc)) return 1;
		if (str->dir == VS_DECODE) {
			slice->last_mb_in_slice = curr_mb_addr;
			curr_mb_addr++;
			if (!vs_has_more_data(str))
				return 0;
			if (h262_mb_addr_inc(str, &tmp)) return 1;
			if (curr_mb_addr >= picparm->pic_size_in_mbs) {
				fprintf(stderr, "MB index overflow\n");
				return 1;
			}
			while (tmp) {
				slice->mbs[curr_mb_addr].macroblock_skipped = 1;
				slice->mbs[curr_mb_addr].macroblock_quant = 0;
				slice->mbs[curr_mb_addr].macroblock_motion_forward = 0;
				slice->mbs[curr_mb_addr].macroblock_motion_backward = 0;
				slice->mbs[curr_mb_addr].macroblock_pattern = 0;
				slice->mbs[curr_mb_addr].macroblock_intra = 0;
				if (h262_infer_vectors(str, seqparm, picparm, &slice->mbs[curr_mb_addr], 0)) return 1;
				if (h262_infer_vectors(str, seqparm, picparm, &slice->mbs[curr_mb_addr], 1)) return 1;
				curr_mb_addr++;
				if (curr_mb_addr >= picparm->pic_size_in_mbs) {
					fprintf(stderr, "MB index overflow\n");
					return 1;
				}
				tmp--;
			}
		} else {
			if (slice->last_mb_in_slice == curr_mb_addr) {
				return 0;
			}
			tmp = 0;
			while (slice->last_mb_in_slice != curr_mb_addr && slice->mbs[curr_mb_addr].macroblock_skipped) {
				tmp++;
				curr_mb_addr++;
			}
			if (slice->last_mb_in_slice == curr_mb_addr) {
				fprintf(stderr, "Last MB in slice is skipped\n");
				return 1;
			}
			if (h262_mb_addr_inc(str, &tmp)) return 1;
		}
	}
	return 0;
}